

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genx.c
# Opt level: O3

genxStatus checkNCName(genxWriter w,constUtf8 name)

{
  uint uVar1;
  genxStatus gVar2;
  constUtf8 local_20;
  
  gVar2 = GENX_BAD_NAME;
  if (((name != (constUtf8)0x0) && (*name != '\0')) &&
     (((local_20 = name, uVar1 = genxNextUnicodeChar(&local_20), uVar1 < 0x10000 &&
       ((w->xmlChars[uVar1] & 2U) != 0)) || ((uVar1 == 0x5f || (uVar1 == 0x3a)))))) {
    while( true ) {
      if (*local_20 == '\0') {
        return GENX_SUCCESS;
      }
      uVar1 = genxNextUnicodeChar(&local_20);
      if (uVar1 == 0xffffffff) break;
      if (0xffff < uVar1) {
        return GENX_BAD_NAME;
      }
      if ((w->xmlChars[uVar1] & 4U) == 0) {
        return GENX_BAD_NAME;
      }
    }
    gVar2 = GENX_BAD_UTF8;
  }
  return gVar2;
}

Assistant:

static genxStatus checkNCName(genxWriter w, constUtf8 name)
{
  int c;

  if (name == NULL || *name == 0)
    return GENX_BAD_NAME;

  c = genxNextUnicodeChar(&name);
  if (!isLetter(w, c) && c != ':' && c != '_')
    return GENX_BAD_NAME;

  while (*name)
  {
    c = genxNextUnicodeChar(&name);
    if (c == -1)
      return GENX_BAD_UTF8;
    if (!isNameChar(w, c))
      return GENX_BAD_NAME;
  }
  return GENX_SUCCESS;
}